

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O0

void Ver_ParseReportUndefBoxes(Ver_Man_t *pMan)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Obj_t *pObj;
  char *pcVar3;
  void *pvVar4;
  uint local_2c;
  int local_28;
  int nBoxes;
  int k;
  int i;
  Abc_Obj_t *pBox;
  Abc_Ntk_t *pNtk;
  Ver_Man_t *pMan_local;
  
  local_2c = 0;
  for (nBoxes = 0; iVar1 = Vec_PtrSize(pMan->pDesign->vModules), nBoxes < iVar1; nBoxes = nBoxes + 1
      ) {
    pAVar2 = (Abc_Ntk_t *)Vec_PtrEntry(pMan->pDesign->vModules,nBoxes);
    pAVar2->fHiePath = 0;
    iVar1 = Ver_NtkIsDefined(pAVar2);
    if (iVar1 == 0) {
      local_2c = local_2c + 1;
    }
  }
  for (nBoxes = 0; iVar1 = Vec_PtrSize(pMan->pDesign->vModules), nBoxes < iVar1; nBoxes = nBoxes + 1
      ) {
    pAVar2 = (Abc_Ntk_t *)Vec_PtrEntry(pMan->pDesign->vModules,nBoxes);
    for (local_28 = 0; iVar1 = Vec_PtrSize(pAVar2->vBoxes), local_28 < iVar1;
        local_28 = local_28 + 1) {
      pObj = Abc_NtkBox(pAVar2,local_28);
      iVar1 = Abc_ObjIsBlackbox(pObj);
      if (((iVar1 != 0) && ((pObj->field_5).pData != (void *)0x0)) &&
         (iVar1 = Ver_NtkIsDefined((Abc_Ntk_t *)(pObj->field_5).pData), iVar1 == 0)) {
        *(int *)((long)(pObj->field_5).pData + 0xc4) =
             *(int *)((long)(pObj->field_5).pData + 0xc4) + 1;
      }
    }
  }
  printf("Warning: The design contains %d undefined object types interpreted as blackboxes:\n",
         (ulong)local_2c);
  for (nBoxes = 0; iVar1 = Vec_PtrSize(pMan->pDesign->vModules), nBoxes < iVar1; nBoxes = nBoxes + 1
      ) {
    pAVar2 = (Abc_Ntk_t *)Vec_PtrEntry(pMan->pDesign->vModules,nBoxes);
    iVar1 = Ver_NtkIsDefined(pAVar2);
    if (iVar1 == 0) {
      pcVar3 = Abc_NtkName(pAVar2);
      printf("%s (%d)  ",pcVar3,(ulong)(uint)pAVar2->fHiePath);
    }
  }
  printf("\n");
  for (nBoxes = 0; iVar1 = Vec_PtrSize(pMan->pDesign->vModules), nBoxes < iVar1; nBoxes = nBoxes + 1
      ) {
    pvVar4 = Vec_PtrEntry(pMan->pDesign->vModules,nBoxes);
    *(undefined4 *)((long)pvVar4 + 0xc4) = 0;
  }
  return;
}

Assistant:

void Ver_ParseReportUndefBoxes( Ver_Man_t * pMan )
{
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pBox;
    int i, k, nBoxes;
    // clean 
    nBoxes = 0;
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
    {
        pNtk->fHiePath = 0;
        if ( !Ver_NtkIsDefined(pNtk) )
            nBoxes++;
    }
    // count
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
        Abc_NtkForEachBlackbox( pNtk, pBox, k )
            if ( pBox->pData && !Ver_NtkIsDefined((Abc_Ntk_t *)pBox->pData) )
                ((Abc_Ntk_t *)pBox->pData)->fHiePath++;
    // print the stats
    printf( "Warning: The design contains %d undefined object types interpreted as blackboxes:\n", nBoxes );
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
        if ( !Ver_NtkIsDefined(pNtk) )
            printf( "%s (%d)  ", Abc_NtkName(pNtk), pNtk->fHiePath );
    printf( "\n" );
    // clean 
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
        pNtk->fHiePath = 0;
}